

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emitterstate.cpp
# Opt level: O1

void __thiscall YAML::EmitterState::SetLocalValue(EmitterState *this,EMITTER_MANIP value)

{
  if (value - EmitNonAscii < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_charset,value,Local);
  }
  if ((value < LowerNull) && ((0x1c1U >> (value & EndMap) & 1) != 0)) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_strFmt,value,Local);
  }
  if (value - YesNoBool < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolFmt,value,Local);
  }
  if (value - UpperCase < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolCaseFmt,value,Local);
  }
  if (value - LongBool < 2) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_boolLengthFmt,value,Local);
  }
  if (value - LowerNull < 4) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_nullFmt,value,Local);
  }
  if (value - Dec < 3) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_intFmt,value,Local);
  }
  if ((value & ~TagByKind) == Flow) {
    _Set<YAML::EMITTER_MANIP>(this,&this->m_seqFmt,value,Local);
    _Set<YAML::EMITTER_MANIP>(this,&this->m_mapFmt,value,Local);
  }
  if ((value != LongKey) && (value != Auto)) {
    return;
  }
  _Set<YAML::EMITTER_MANIP>(this,&this->m_mapKeyFmt,value,Local);
  return;
}

Assistant:

void EmitterState::SetLocalValue(EMITTER_MANIP value) {
  SetOutputCharset(value, FmtScope::Local);
  SetStringFormat(value, FmtScope::Local);
  SetBoolFormat(value, FmtScope::Local);
  SetBoolCaseFormat(value, FmtScope::Local);
  SetBoolLengthFormat(value, FmtScope::Local);
  SetNullFormat(value, FmtScope::Local);
  SetIntFormat(value, FmtScope::Local);
  SetFlowType(GroupType::Seq, value, FmtScope::Local);
  SetFlowType(GroupType::Map, value, FmtScope::Local);
  SetMapKeyFormat(value, FmtScope::Local);
}